

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::ruby::GenerateEnumAssignment
          (ruby *this,string_view prefix,EnumDescriptor *en,Printer *printer)

{
  string_view name;
  string_view text;
  string_view text_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string_view prefix_local;
  
  prefix_local._M_str = (char *)prefix._M_len;
  name._M_str = (char *)this;
  name._M_len = local_50.field_2._8_8_;
  prefix_local._M_len = (size_t)this;
  RubifyConstant_abi_cxx11_(name);
  text._M_str = "$prefix$$name$ = ";
  text._M_len = 0x11;
  io::Printer::
  Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
            ((Printer *)en,text,(char (*) [7])0x10a7cf9,&prefix_local,(char (*) [5])0xd8d1e3,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_50._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(*(long *)(prefix._M_str + 8) + 2);
  local_50._M_string_length = ~(ulong)local_50._M_dataplus._M_p + *(long *)(prefix._M_str + 8);
  text_00._M_str =
       "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").enummodule\n";
  text_00._M_len = 0x53;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)en,text_00,(char (*) [10])0x10a7999,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  return;
}

Assistant:

void GenerateEnumAssignment(absl::string_view prefix, const EnumDescriptor* en,
                            io::Printer* printer) {
  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(en->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").enummodule\n",
      "full_name", en->full_name());
}